

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_manifold(REF_CAVITY ref_cavity,REF_BOOL *manifold)

{
  REF_CELL pRVar1;
  REF_INT *pRVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint local_bc;
  REF_BOOL contains;
  REF_INT cell;
  REF_BOOL *local_b0;
  REF_INT nodes [27];
  
  *manifold = 0;
  iVar5 = ref_cavity->surf_node;
  if (iVar5 == -1) {
    iVar5 = ref_cavity->node;
  }
  pRVar1 = ref_cavity->ref_grid->cell[3];
  lVar6 = 8;
  local_b0 = manifold;
  for (lVar7 = 0; lVar7 < ref_cavity->maxseg; lVar7 = lVar7 + 1) {
    pRVar2 = ref_cavity->s2n;
    nodes[0] = *(int *)((long)pRVar2 + lVar6 + -8);
    if ((iVar5 != nodes[0] && nodes[0] != -1) && (iVar5 != *(int *)((long)pRVar2 + lVar6 + -4))) {
      nodes[1] = *(REF_INT *)((long)pRVar2 + lVar6 + -4);
      nodes[3] = *(REF_INT *)((long)pRVar2 + lVar6);
      nodes[2] = iVar5;
      uVar3 = ref_cell_with(pRVar1,nodes,&cell);
      if ((uVar3 != 0) && (uVar3 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x6ae,"ref_cavity_manifold",(ulong)uVar3,"with manifold search failed");
        local_bc = uVar3;
      }
      if ((uVar3 != 5) && (uVar3 != 0)) {
        return local_bc;
      }
      if (cell != -1) {
        uVar3 = ref_list_contains(ref_cavity->tri_list,cell,&contains);
        if (uVar3 != 0) {
          uVar4 = 0x6b1;
          goto LAB_00119916;
        }
        if (contains == 0) goto LAB_001198be;
      }
    }
    lVar6 = lVar6 + 0xc;
  }
  iVar5 = ref_cavity->node;
  pRVar1 = ref_cavity->ref_grid->cell[8];
  lVar6 = 8;
  lVar7 = 0;
  do {
    if (ref_cavity->maxface <= lVar7) {
      *local_b0 = 1;
      return 0;
    }
    pRVar2 = ref_cavity->f2n;
    nodes[0] = *(int *)((long)pRVar2 + lVar6 + -8);
    if (((iVar5 != nodes[0] && nodes[0] != -1) && (iVar5 != *(int *)((long)pRVar2 + lVar6 + -4))) &&
       (iVar5 != *(int *)((long)pRVar2 + lVar6))) {
      nodes[1] = *(REF_INT *)((long)pRVar2 + lVar6 + -4);
      nodes[2] = *(REF_INT *)((long)pRVar2 + lVar6);
      nodes[3] = iVar5;
      uVar3 = ref_cell_with(pRVar1,nodes,&cell);
      if ((uVar3 != 0) && (uVar3 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x6c8,"ref_cavity_manifold",(ulong)uVar3,"with manifold search failed");
        local_bc = uVar3;
      }
      if ((uVar3 != 5) && (uVar3 != 0)) {
        return local_bc;
      }
      if (cell != -1) {
        uVar3 = ref_list_contains(ref_cavity->tet_list,cell,&contains);
        if (uVar3 != 0) {
          uVar4 = 0x6cb;
LAB_00119916:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar4,"ref_cavity_manifold",(ulong)uVar3,"contains a plan to remove");
          return uVar3;
        }
        if (contains == 0) {
LAB_001198be:
          *local_b0 = 0;
          return 0;
        }
      }
    }
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0xc;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_manifold(REF_CAVITY ref_cavity,
                                              REF_BOOL *manifold) {
  REF_INT node;
  REF_CELL ref_cell;
  REF_INT seg, face;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL contains;

  *manifold = REF_FALSE;

  node = ref_cavity_seg_node(ref_cavity);
  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    /* skip a seg attached to node */
    if (node == ref_cavity_s2n(ref_cavity, 0, seg) ||
        node == ref_cavity_s2n(ref_cavity, 1, seg))
      continue;

    nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
    nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
    nodes[2] = node;
    nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);

    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND,
        "with manifold search failed");
    if (REF_EMPTY != cell) {
      RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell, &contains),
          "contains a plan to remove");
      if (!contains) {
        *manifold = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  node = ref_cavity_node(ref_cavity);
  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_face(ref_cavity, face) {
    /* skip a face attached to node */
    if (node == ref_cavity_f2n(ref_cavity, 0, face) ||
        node == ref_cavity_f2n(ref_cavity, 1, face) ||
        node == ref_cavity_f2n(ref_cavity, 2, face))
      continue;

    nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
    nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
    nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
    nodes[3] = node;

    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND,
        "with manifold search failed");
    if (REF_EMPTY != cell) {
      RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell, &contains),
          "contains a plan to remove");
      if (!contains) {
        *manifold = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  *manifold = REF_TRUE;

  return REF_SUCCESS;
}